

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::CompletionFlag::CompletionFlag<args::ArgumentParser>
          (CompletionFlag *this,ArgumentParser *group_,Matcher *matcher_)

{
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  Matcher *local_20;
  Matcher *matcher__local;
  ArgumentParser *group__local;
  CompletionFlag *this_local;
  
  local_20 = matcher_;
  matcher__local = (Matcher *)group_;
  group__local = (ArgumentParser *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"completion",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"completion flag",&local_79);
  ValueFlagBase::ValueFlagBase(&this->super_ValueFlagBase,&local_40,&local_78,local_20,Hidden);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__CompletionFlag_001426a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reply);
  this->cword = 0;
  std::__cxx11::string::string((string *)&this->syntax);
  ArgumentParser::AddCompletion((ArgumentParser *)matcher__local,this);
  return;
}

Assistant:

CompletionFlag(GroupClass &group_, Matcher &&matcher_): ValueFlagBase("completion", "completion flag", std::move(matcher_), Options::Hidden)
            {
                group_.AddCompletion(*this);
            }